

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssh2_pick_fingerprint.c
# Opt level: O1

FingerprintType ssh2_pick_fingerprint(char **fingerprints,FingerprintType preferred_type)

{
  ulong uVar1;
  
  uVar1 = 0;
  if (fingerprints[preferred_type] != (char *)0x0) {
    uVar1 = (ulong)preferred_type;
  }
  if (fingerprints[uVar1] != (char *)0x0) {
    return (FingerprintType)uVar1;
  }
  __assert_fail("fingerprints[fptype]",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/ssh2_pick_fingerprint.c"
                ,0x14,"FingerprintType ssh2_pick_fingerprint(char **, FingerprintType)");
}

Assistant:

FingerprintType ssh2_pick_fingerprint(
    char **fingerprints, FingerprintType preferred_type)
{
    /*
     * Keys are either SSH-2, in which case we have all fingerprint
     * types, or SSH-1, in which case we have only MD5. So we return
     * the default type if we can, or MD5 if that's all we have; no
     * need for a fully general preference-list system.
     */
    FingerprintType fptype = fingerprints[preferred_type] ?
        preferred_type : SSH_FPTYPE_MD5;
    assert(fingerprints[fptype]);
    return fptype;
}